

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
hedg::utils::get_ids
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,
          queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
          *market_ids,
          deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
          *subscribed,int max_markets)

{
  uint uVar1;
  _Elt_pointer ppVar2;
  _Elt_pointer ppVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  string id_string;
  
  id_string._M_dataplus._M_p = (pointer)&id_string.field_2;
  id_string._M_string_length = 0;
  id_string.field_2._M_local_buf[0] = '\0';
  bVar6 = (market_ids->c).
          super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (market_ids->c).
          super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (bVar6) {
    std::__cxx11::string::append((char *)&id_string);
    std::__cxx11::string::append((string *)&id_string);
    std::__cxx11::string::append((char *)&id_string);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::push_back(subscribed,
                (market_ids->c).
                super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::pop_front(&market_ids->c);
    max_markets = max_markets + -1;
  }
  uVar4 = (uint)bVar6;
  uVar1 = max_markets + (uint)bVar6;
  while( true ) {
    ppVar2 = (market_ids->c).
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar3 = (market_ids->c).
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    uVar5 = uVar4;
    if ((ppVar3 == ppVar2) ||
       (bVar6 = max_markets == 0, max_markets = max_markets + -1, uVar5 = uVar1, bVar6)) break;
    std::__cxx11::string::append((char *)&id_string);
    std::__cxx11::string::append((char *)&id_string);
    std::__cxx11::string::append((string *)&id_string);
    std::__cxx11::string::append((char *)&id_string);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::push_back(subscribed,
                (market_ids->c).
                super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::pop_front(&market_ids->c);
    uVar4 = uVar4 + 1;
  }
  while (ppVar3 != ppVar2) {
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::pop_front(&market_ids->c);
    ppVar2 = (market_ids->c).
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar3 = (market_ids->c).
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&id_string);
  __return_storage_ptr__->second = uVar5;
  std::__cxx11::string::~string((string *)&id_string);
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::system_error vsystem_error(int error_code, string_view format_str,
                                         format_args args) {
  auto ec = std::error_code(error_code, std::generic_category());
  return std::system_error(ec, vformat(format_str, args));
}